

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

char * docopt::value::kindAsString(Kind kind)

{
  if (kind < (StringList|Bool)) {
    return &DAT_001b0ac8 + *(int *)(&DAT_001b0ac8 + (ulong)kind * 4);
  }
  return "unknown";
}

Assistant:

const char* value::kindAsString(Kind kind)
{
	switch (kind) {
		case Kind::Empty: return "empty";
		case Kind::Bool: return "bool";
		case Kind::Long: return "long";
		case Kind::String: return "string";
		case Kind::StringList: return "string-list";
	}
	return "unknown";
}